

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O3

unsigned_long __thiscall
DivideTest<unsigned_long>::random_denominator(DivideTest<unsigned_long> *this)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  
  uVar4 = this->seed * 0x19660d + 0x3c6ef35f;
  this->seed = uVar4;
  uVar2 = this->rand_n;
  uVar1 = ((uVar4 & 1) + 1) * uVar2 + 3 + uVar2 % 0x1c9c381;
  uVar3 = (ulong)(uVar4 % 0x13);
  if (uVar2 <= uVar1) {
    uVar3 = uVar1;
  }
  if (uVar3 == 0) {
    this->seed = uVar4 * 0x19660d + 0x3c6ef35f;
    uVar3 = 3;
  }
  this->rand_n = uVar3;
  return uVar3;
}

Assistant:

T get_random() {
        // https://en.wikipedia.org/wiki/Linear_congruential_generator
        seed = seed * 1664525 + 1013904223;

        UT old = rand_n;
        rand_n = rand_n * (seed % 2 + 1) + rand_n % 30000001 + 3;

        // Reset upon integer overflow
        if (rand_n < old) {
            rand_n = seed % 19;
        }

        // The algorithm above generates mostly positive numbers.
        // Hence convert 50% of all values to negative.
        if (limits::is_signed) {
            if (seed % 2) return -(T)rand_n;
        }

        return (T)rand_n;
    }